

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,signed_char,duckdb::DefaultMapType<std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t size;
  Vector *pVVar4;
  Vector *pVVar5;
  ulong uVar6;
  long *plVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t i_1;
  ulong uVar10;
  long lVar11;
  long lVar12;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar11 = 0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar9 = iVar8;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar8];
    }
    if (**(long **)(local_78.data + iVar9 * 8) != 0) {
      lVar11 = lVar11 + *(long *)(**(long **)(local_78.data + iVar9 * 8) + 0x18);
    }
  }
  ListVector::Reserve(result,lVar11 + size);
  pVVar4 = MapVector::GetKeys(result);
  pVVar5 = MapVector::GetValues(result);
  pdVar2 = result->data;
  pdVar3 = pVVar5->data;
  for (uVar10 = 0; uVar10 != count; uVar10 = uVar10 + 1) {
    uVar6 = uVar10;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(local_78.sel)->sel_vector[uVar10];
    }
    lVar11 = **(long **)(local_78.data + uVar6 * 8);
    if (lVar11 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10 + offset);
    }
    else {
      lVar12 = (uVar10 + offset) * 0x10;
      plVar1 = (long *)(pdVar2 + lVar12);
      *(idx_t *)(pdVar2 + lVar12) = size;
      plVar7 = (long *)(lVar11 + 0x10);
      while (plVar7 = (long *)*plVar7, plVar7 != (long *)0x0) {
        pVVar4->data[size] = *(data_t *)(plVar7 + 1);
        *(long *)(pdVar3 + size * 8) = plVar7[2];
        size = size + 1;
      }
      plVar1[1] = size - *plVar1;
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}